

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int read_message(FILE *fp,mg_connection *conn,char *buf,int bufsiz,int *nread)

{
  double dVar1;
  double local_58;
  double request_timeout;
  timespec last_action_time;
  int n;
  int request_len;
  int *nread_local;
  int bufsiz_local;
  char *buf_local;
  mg_connection *conn_local;
  FILE *fp_local;
  
  last_action_time.tv_nsec._0_4_ = 0;
  if (conn == (mg_connection *)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    memset(&request_timeout,0,0x10);
    if (conn->dom_ctx->config[0xb] == (char *)0x0) {
      local_58 = strtod("30000",(char **)0x0);
    }
    else {
      local_58 = strtod(conn->dom_ctx->config[0xb],(char **)0x0);
    }
    local_58 = local_58 / 1000.0;
    if ((0 < conn->handled_requests) && (conn->dom_ctx->config[0xc] != (char *)0x0)) {
      local_58 = strtod(conn->dom_ctx->config[0xc],(char **)0x0);
      local_58 = local_58 / 1000.0;
    }
    last_action_time.tv_nsec._4_4_ = get_http_header_len(buf,*nread);
    do {
      if (last_action_time.tv_nsec._4_4_ != 0) {
        return last_action_time.tv_nsec._4_4_;
      }
      if (conn->phys_ctx->stop_flag != 0) {
        return -1;
      }
      if (bufsiz <= *nread) {
        return -2;
      }
      last_action_time.tv_nsec._0_4_ = pull_inner(fp,conn,buf + *nread,bufsiz - *nread,local_58);
      if ((int)last_action_time.tv_nsec == -2) {
        return -1;
      }
      clock_gettime(1,(timespec *)&request_timeout);
      if (0 < (int)last_action_time.tv_nsec) {
        *nread = (int)last_action_time.tv_nsec + *nread;
        last_action_time.tv_nsec._4_4_ = get_http_header_len(buf,*nread);
      }
    } while (((last_action_time.tv_nsec._4_4_ != 0) || (local_58 < 0.0)) ||
            (dVar1 = mg_difftimespec((timespec *)&request_timeout,&conn->req_time),
            dVar1 <= local_58));
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

static int
read_message(FILE *fp,
             struct mg_connection *conn,
             char *buf,
             int bufsiz,
             int *nread)
{
	int request_len, n = 0;
	struct timespec last_action_time;
	double request_timeout;

	if (!conn) {
		return 0;
	}

	memset(&last_action_time, 0, sizeof(last_action_time));

	if (conn->dom_ctx->config[REQUEST_TIMEOUT]) {
		/* value of request_timeout is in seconds, config in milliseconds */
		request_timeout =
		    strtod(conn->dom_ctx->config[REQUEST_TIMEOUT], NULL) / 1000.0;
	} else {
		request_timeout =
		    strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		    / 1000.0;
	}
	if (conn->handled_requests > 0) {
		if (conn->dom_ctx->config[KEEP_ALIVE_TIMEOUT]) {
			request_timeout =
			    strtod(conn->dom_ctx->config[KEEP_ALIVE_TIMEOUT], NULL)
			    / 1000.0;
		}
	}

	request_len = get_http_header_len(buf, *nread);

	while (request_len == 0) {
		/* Full request not yet received */
		if (!STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
			/* Server is to be stopped. */
			return -1;
		}

		if (*nread >= bufsiz) {
			/* Request too long */
			return -2;
		}

		n = pull_inner(
		    fp, conn, buf + *nread, bufsiz - *nread, request_timeout);
		if (n == -2) {
			/* Receive error */
			return -1;
		}

		/* update clock after every read request */
		clock_gettime(CLOCK_MONOTONIC, &last_action_time);

		if (n > 0) {
			*nread += n;
			request_len = get_http_header_len(buf, *nread);
		}

		if ((request_len == 0) && (request_timeout >= 0)) {
			if (mg_difftimespec(&last_action_time, &(conn->req_time))
			    > request_timeout) {
				/* Timeout */
				return -1;
			}
		}
	}

	return request_len;
}